

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  EmitterType EVar1;
  Arch AVar2;
  BaseEmitter *in_RSI;
  CodeHolder *in_RDI;
  Error _err_1;
  Error _err;
  uint64_t archMask;
  EmitterType type;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  BaseEmitter **item;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Error local_4;
  
  if (in_RSI == (BaseEmitter *)0x0) {
    local_4 = DebugUtils::errored(2);
  }
  else {
    EVar1 = BaseEmitter::emitterType(in_RSI);
    n = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
    if (EVar1 != kNone) {
      n = CONCAT13(kCompiler < EVar1,(int3)in_stack_ffffffffffffffc4);
    }
    if ((char)(n >> 0x18) == '\0') {
      item = (BaseEmitter **)in_RSI->_archMask;
      AVar2 = arch((CodeHolder *)0x1196dc);
      if (((ulong)item & 1L << (AVar2 & 0x3f)) == 0) {
        local_4 = DebugUtils::errored(4);
      }
      else if (in_RSI->_code == (CodeHolder *)0x0) {
        local_4 = ZoneVector<asmjit::_abi_1_10::BaseEmitter_*>::willGrow
                            ((ZoneVector<asmjit::_abi_1_10::BaseEmitter_*> *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (ZoneAllocator *)in_RDI,n);
        if ((local_4 == 0) &&
           (local_4 = (*in_RSI->_vptr_BaseEmitter[0x10])(in_RSI,in_RDI), local_4 == 0)) {
          if (in_RSI->_code != in_RDI) {
            DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
          }
          ZoneVector<asmjit::_abi_1_10::BaseEmitter_*>::appendUnsafe
                    ((ZoneVector<asmjit::_abi_1_10::BaseEmitter_*> *)
                     CONCAT44(n,in_stack_ffffffffffffffc0),item);
          local_4 = 0;
        }
      }
      else if (in_RSI->_code == in_RDI) {
        local_4 = 0;
      }
      else {
        local_4 = DebugUtils::errored(3);
      }
    }
    else {
      local_4 = DebugUtils::errored(3);
    }
  }
  return local_4;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  EmitterType type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == EmitterType::kNone || uint32_t(type) > uint32_t(EmitterType::kMaxValue)))
    return DebugUtils::errored(kErrorInvalidState);

  uint64_t archMask = emitter->_archMask;
  if (ASMJIT_UNLIKELY(!(archMask & (uint64_t(1) << uint32_t(arch())))))
    return DebugUtils::errored(kErrorInvalidArch);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}